

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgreen_value_tests.c
# Opt level: O2

TestSuite * cgreen_value_tests(void)

{
  TestSuite *pTVar1;
  
  pTVar1 = (TestSuite *)
           create_named_test_suite_
                     ("cgreen_value_tests",
                      "/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/cgreen_value_tests.c"
                      ,0x33);
  add_test_(pTVar1,"makes_integer_value",&CgreenSpec__CgreenValue__makes_integer_value__);
  add_test_(pTVar1,"makes_string_value",&CgreenSpec__CgreenValue__makes_string_value__);
  add_test_(pTVar1,"makes_pointer_value",&CgreenSpec__CgreenValue__makes_pointer_value__);
  add_test_(pTVar1,"makes_double_value",&CgreenSpec__CgreenValue__makes_double_value__);
  add_test_(pTVar1,"makes_by_value",&CgreenSpec__CgreenValue__makes_by_value__);
  return pTVar1;
}

Assistant:

TestSuite *cgreen_value_tests(void) {
    TestSuite *suite = create_test_suite();

    add_test_with_context(suite, CgreenValue, makes_integer_value);
    add_test_with_context(suite, CgreenValue, makes_string_value);
    add_test_with_context(suite, CgreenValue, makes_pointer_value);
    add_test_with_context(suite, CgreenValue, makes_double_value);
    add_test_with_context(suite, CgreenValue, makes_by_value);

    return suite;
}